

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagged_union.hpp
# Opt level: O0

void type_safe::detail::
     with_union<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp:577:17)_&&,_type_safe::tagged_union<int,_double,_debugger_type>_&,_type_safe::union_types<int,_double,_debugger_type>_>
     ::with_impl<debugger_type>
               (tagged_union<int,_double,_debugger_type> *param_1,anon_class_1_0_00000001 *param_2)

{
  bool bVar1;
  equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *lhs;
  union_type<debugger_type> local_21;
  anon_class_1_0_00000001 *local_20;
  anon_class_1_0_00000001 *func_local;
  tagged_union<int,_double,_debugger_type> *u_local;
  
  local_20 = param_2;
  func_local = (anon_class_1_0_00000001 *)param_1;
  lhs = (equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *)
        tagged_union<int,_double,_debugger_type>::type(param_1);
  union_type<debugger_type>::union_type(&local_21);
  bVar1 = strong_typedef_op::operator==(lhs,&local_21);
  if (bVar1) {
    call<debugger_type>(0,(tagged_union<int,_double,_debugger_type> *)func_local,local_20);
  }
  else {
    with_impl(func_local,local_20);
  }
  return;
}

Assistant:

static void with_impl(union_types<Head, Tail...>, Union&& u, Func&& func, Args&&... args)
        {
            if (u.type() == union_type<Head>{})
                call<Head>(0, std::forward<Union>(u), std::forward<Func>(func),
                           std::forward<Args>(args)...);
            else
                with_impl(union_types<Tail...>{}, std::forward<Union>(u), std::forward<Func>(func),
                          std::forward<Args>(args)...);
        }